

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

Maybe<const_kj::HashMap<kj::StringPtr,_capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Entry_&>
__thiscall
kj::
Table<kj::HashMap<kj::StringPtr,capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Entry,kj::HashIndex<kj::HashMap<kj::StringPtr,capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Callbacks>>
::find<0ul,kj::StringPtr&>
          (Table<kj::HashMap<kj::StringPtr,capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Entry,kj::HashIndex<kj::HashMap<kj::StringPtr,capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Callbacks>>
           *this,StringPtr *params)

{
  Entry *pEVar1;
  NullableValue<unsigned_long> *other;
  unsigned_long *puVar2;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 in_RDX;
  ArrayPtr<const_kj::HashMap<kj::StringPtr,_capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Entry>
  AVar3;
  unsigned_long *pos;
  Entry *local_50;
  StringPtr *local_48;
  Maybe<unsigned_long> local_40;
  undefined1 local_30 [8];
  NullableValue<unsigned_long> _pos597;
  StringPtr *params_local;
  Table<kj::HashMap<kj::StringPtr,_capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Entry,_kj::HashIndex<kj::HashMap<kj::StringPtr,_capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Callbacks>_>
  *this_local;
  
  _pos597.field_1 = in_RDX;
  pEVar1 = (Entry *)get<0ul,kj::HashIndex<kj::HashMap<kj::StringPtr,capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Callbacks>const&>
                              ((HashIndex<kj::HashMap<kj::StringPtr,_capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Callbacks>
                                *)(params + 2));
  AVar3 = Vector<kj::HashMap<kj::StringPtr,_capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Entry>
          ::asPtr((Vector<kj::HashMap<kj::StringPtr,_capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Entry>
                   *)params);
  fwd<kj::StringPtr&>((StringPtr *)_pos597.field_1);
  local_50 = AVar3.ptr;
  local_48 = (StringPtr *)AVar3.size_;
  AVar3.size_ = (size_t)local_50;
  AVar3.ptr = pEVar1;
  HashIndex<kj::HashMap<kj::StringPtr,capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Callbacks>
  ::
  find<kj::HashMap<kj::StringPtr,capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Entry_const,kj::StringPtr&>
            ((HashIndex<kj::HashMap<kj::StringPtr,capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Callbacks>
              *)&local_40,AVar3,local_48);
  other = kj::_::readMaybe<unsigned_long>(&local_40);
  kj::_::NullableValue<unsigned_long>::NullableValue((NullableValue<unsigned_long> *)local_30,other)
  ;
  Maybe<unsigned_long>::~Maybe(&local_40);
  puVar2 = kj::_::NullableValue::operator_cast_to_unsigned_long_((NullableValue *)local_30);
  if (puVar2 == (unsigned_long *)0x0) {
    Maybe<const_kj::HashMap<kj::StringPtr,_capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Entry_&>
    ::Maybe((Maybe<const_kj::HashMap<kj::StringPtr,_capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Entry_&>
             *)this);
  }
  else {
    puVar2 = kj::_::NullableValue<unsigned_long>::operator*
                       ((NullableValue<unsigned_long> *)local_30);
    pEVar1 = Vector<kj::HashMap<kj::StringPtr,_capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Entry>
             ::operator[]((Vector<kj::HashMap<kj::StringPtr,_capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Entry>
                           *)params,*puVar2);
    Maybe<const_kj::HashMap<kj::StringPtr,_capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Entry_&>
    ::Maybe((Maybe<const_kj::HashMap<kj::StringPtr,_capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Entry_&>
             *)this,pEVar1);
  }
  kj::_::NullableValue<unsigned_long>::~NullableValue((NullableValue<unsigned_long> *)local_30);
  return (Maybe<const_kj::HashMap<kj::StringPtr,_capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Entry_&>
          )(Entry *)this;
}

Assistant:

kj::Maybe<const Row&> Table<Row, Indexes...>::find(Params&&... params) const {
  KJ_IF_SOME(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    return rows[pos];
  } else {
    return kj::none;
  }
}